

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *config,
          string *lang,string *arch)

{
  pointer pcVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  _Storage<cmSwiftCompileMode,_true> _Var5;
  optional<cmSwiftCompileMode> oVar6;
  string *psVar7;
  cmValue cVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  cmLocalGenerator *pcVar10;
  char *pcVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string compileFlags;
  string swiftCompileModeFlag;
  undefined1 local_d8 [32];
  undefined1 local_b8 [40];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  char *local_70;
  cmMakefile *local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._0_8_ = local_d8 + 0x10;
  local_d8._8_8_ = (cmState *)0x0;
  local_d8[0x10] = '\0';
  this_00 = this->Makefile;
  AddLanguageFlags(this,(string *)local_d8,target,Compile,lang,config);
  bVar3 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar3) {
    AppendFeatureOptions(this,(string *)local_d8,lang,"IPO");
  }
  AddArchitectureFlags(this,(string *)local_d8,target,lang,config,arch);
  iVar4 = std::__cxx11::string::compare((char *)lang);
  if (iVar4 == 0) {
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[0x11])(local_b8,this,target,config);
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,local_d8,local_b8);
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._16_8_;
    pcVar11 = (char *)local_b8._0_8_;
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) goto LAB_0035c710;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)lang);
    if ((iVar4 != 0) ||
       (oVar6 = GetSwiftCompileMode(this,target,config),
       ((ulong)oVar6.super__Optional_base<cmSwiftCompileMode,_true,_true>._M_payload.
               super__Optional_payload_base<cmSwiftCompileMode> >> 0x20 & 1) == 0))
    goto LAB_0035c710;
    local_70 = &local_60;
    local_68 = (cmMakefile *)0x0;
    local_60 = '\0';
    _Var5._M_value =
         oVar6.super__Optional_base<cmSwiftCompileMode,_true,_true>._M_payload.
         super__Optional_payload_base<cmSwiftCompileMode>._M_payload;
    if (_Var5._M_value == Wholemodule) {
      std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,0x93778d);
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"CMAKE_Swift_COMPILE_OPTIONS_WMO","");
      cVar8 = cmMakefile::GetDefinition(this_00,(string *)local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      if (cVar8.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
    }
    else if (_Var5._M_value == Incremental) {
      std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,0x937758);
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"CMAKE_Swift_COMPILE_OPTIONS_INCREMENTAL","");
      cVar8 = cmMakefile::GetDefinition(this_00,(string *)local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      if (cVar8.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
    }
    else if (_Var5._M_value == Unknown) {
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      local_b8._0_8_ = (char *)0x2a;
      local_b8._8_8_ = "Unknown Swift_COMPILATION_MODE on target \'";
      local_b8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_b8._32_8_ = (psVar7->_M_dataplus)._M_p;
      local_b8._24_8_ = psVar7->_M_string_length;
      local_90._M_p = (pointer)0x0;
      local_88 = 1;
      local_80._M_allocated_capacity = (long)"<bindir> is not an absolute path:\n \'" + 0x23;
      local_80._8_8_ = 0;
      views._M_len = 3;
      views._M_array = (iterator)local_b8;
      cmCatViews(&local_50,views);
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_50,
                          &this->DirectoryBacktrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,local_d8,&local_70);
    if (local_70 == &local_60) goto LAB_0035c710;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(uStack_5f,local_60);
    pcVar11 = local_70;
  }
  operator_delete(pcVar11,(ulong)((long)&(pbVar9->_M_dataplus)._M_p + 1));
LAB_0035c710:
  AddCMP0018Flags(this,(string *)local_d8,target,lang,config);
  AddVisibilityPresetFlags(this,(string *)local_d8,target,lang);
  AddColorDiagnosticsFlags(this,(string *)local_d8,lang);
  pcVar1 = local_b8 + 0x10;
  pcVar2 = (this_00->DefineFlags)._M_dataplus._M_p;
  local_b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,pcVar2,pcVar2 + (this_00->DefineFlags)._M_string_length);
  pcVar10 = (cmLocalGenerator *)local_d8;
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,pcVar10,local_b8);
  if ((pointer)local_b8._0_8_ != pcVar1) {
    pcVar10 = (cmLocalGenerator *)(local_b8._16_8_ + 1);
    operator_delete((void *)local_b8._0_8_,(ulong)pcVar10);
  }
  GetFrameworkFlags((string *)local_b8,pcVar10,lang,config,target);
  pcVar10 = (cmLocalGenerator *)local_d8;
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,pcVar10,local_b8);
  if ((pointer)local_b8._0_8_ != pcVar1) {
    pcVar10 = (cmLocalGenerator *)(local_b8._16_8_ + 1);
    operator_delete((void *)local_b8._0_8_,(ulong)pcVar10);
  }
  GetXcFrameworkFlags((string *)local_b8,pcVar10,lang,config,target);
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,local_d8,local_b8);
  if ((pointer)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
  }
  if ((cmState *)local_d8._8_8_ != (cmState *)0x0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  }
  AddCompileOptions(this,__return_storage_ptr__,target,lang,config);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmLocalGenerator::GetTargetCompileFlags(
  cmGeneratorTarget* target, std::string const& config,
  std::string const& lang, std::string const& arch)
{
  std::vector<BT<std::string>> flags;
  std::string compileFlags;

  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(compileFlags, target, cmBuildStep::Compile, lang,
                         config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(compileFlags, lang, "IPO");
  }

  this->AddArchitectureFlags(compileFlags, target, lang, config, arch);

  if (lang == "Fortran") {
    this->AppendFlags(compileFlags,
                      this->GetTargetFortranFlags(target, config));
  } else if (lang == "Swift") {
    // Only set the compile mode if CMP0157 is set
    if (cm::optional<cmSwiftCompileMode> swiftCompileMode =
          this->GetSwiftCompileMode(target, config)) {
      std::string swiftCompileModeFlag;
      switch (*swiftCompileMode) {
        case cmSwiftCompileMode::Incremental: {
          swiftCompileModeFlag = "-incremental";
          if (cmValue flag =
                mf->GetDefinition("CMAKE_Swift_COMPILE_OPTIONS_INCREMENTAL")) {
            swiftCompileModeFlag = *flag;
          }
          break;
        }
        case cmSwiftCompileMode::Wholemodule: {
          swiftCompileModeFlag = "-wmo";
          if (cmValue flag =
                mf->GetDefinition("CMAKE_Swift_COMPILE_OPTIONS_WMO")) {
            swiftCompileModeFlag = *flag;
          }
          break;
        }
        case cmSwiftCompileMode::Singlefile:
          break;
        case cmSwiftCompileMode::Unknown: {
          this->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("Unknown Swift_COMPILATION_MODE on target '",
                     target->GetName(), "'"));
        }
      }
      this->AppendFlags(compileFlags, swiftCompileModeFlag);
    }
  }

  this->AddCMP0018Flags(compileFlags, target, lang, config);
  this->AddVisibilityPresetFlags(compileFlags, target, lang);
  this->AddColorDiagnosticsFlags(compileFlags, lang);
  this->AppendFlags(compileFlags, mf->GetDefineFlags());
  this->AppendFlags(compileFlags,
                    this->GetFrameworkFlags(lang, config, target));
  this->AppendFlags(compileFlags,
                    this->GetXcFrameworkFlags(lang, config, target));

  if (!compileFlags.empty()) {
    flags.emplace_back(std::move(compileFlags));
  }
  this->AddCompileOptions(flags, target, lang, config);
  return flags;
}